

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O0

void __thiscall
Assimp::FindDegeneratesProcess::Execute(FindDegeneratesProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  uint local_1c;
  uint i;
  aiScene *pScene_local;
  FindDegeneratesProcess *this_local;
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"FindDegeneratesProcess begin");
  for (local_1c = 0; local_1c < pScene->mNumMeshes; local_1c = local_1c + 1) {
    if ((pScene->mMeshes[local_1c]->mPrimitiveTypes != 1) &&
       (bVar1 = ExecuteOnMesh(this,pScene->mMeshes[local_1c]), bVar1)) {
      removeMesh(pScene,local_1c);
      local_1c = local_1c - 1;
    }
  }
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"FindDegeneratesProcess finished");
  return;
}

Assistant:

void FindDegeneratesProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("FindDegeneratesProcess begin");
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
    {
        //Do not process point cloud, ExecuteOnMesh works only with faces data
        if ((pScene->mMeshes[i]->mPrimitiveTypes != aiPrimitiveType::aiPrimitiveType_POINT) && ExecuteOnMesh(pScene->mMeshes[i])) {
            removeMesh(pScene, i);
            --i; //the current i is removed, do not skip the next one
        }
    }
    ASSIMP_LOG_DEBUG("FindDegeneratesProcess finished");
}